

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

void hufCanonicalCodeTable(uint64_t *hcode)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long in_RDI;
  int local_20c;
  int local_1fc;
  ulong local_1f8;
  int local_1f0;
  int local_1ec;
  ulong auStack_1e8 [45];
  uint64_t l;
  int i_3;
  uint64_t nc;
  int i_2;
  uint64_t c;
  int i_1;
  int i;
  long local_8;
  
  for (local_1ec = 0; local_1ec < 0x3b; local_1ec = local_1ec + 1) {
    auStack_1e8[local_1ec] = 0;
  }
  local_8 = in_RDI;
  for (local_1f0 = 0; local_1f0 < 0x10001; local_1f0 = local_1f0 + 1) {
    lVar1 = *(long *)(local_8 + (long)local_1f0 * 8);
    auStack_1e8[lVar1] = auStack_1e8[lVar1] + 1;
  }
  local_1f8 = 0;
  for (local_1fc = 0x3a; 0 < local_1fc; local_1fc = local_1fc + -1) {
    uVar2 = auStack_1e8[local_1fc];
    auStack_1e8[local_1fc] = local_1f8;
    local_1f8 = local_1f8 + uVar2 >> 1;
  }
  for (local_20c = 0; local_20c < 0x10001; local_20c = local_20c + 1) {
    uVar2 = *(ulong *)(local_8 + (long)local_20c * 8);
    if (uVar2 != 0) {
      uVar3 = auStack_1e8[uVar2];
      auStack_1e8[uVar2] = uVar3 + 1;
      *(ulong *)(local_8 + (long)local_20c * 8) = uVar2 | uVar3 << 6;
    }
  }
  return;
}

Assistant:

static void
hufCanonicalCodeTable (uint64_t* hcode)
{
    uint64_t n[59];

    //
    // For each i from 0 through 58, count the
    // number of different codes of length i, and
    // store the count in n[i].
    //

    for (int i = 0; i <= 58; ++i)
        n[i] = 0;

    for (int i = 0; i < HUF_ENCSIZE; ++i)
        n[hcode[i]] += 1;

    //
    // For each i from 58 through 1, compute the
    // numerically lowest code with length i, and
    // store that code in n[i].
    //

    uint64_t c = 0;

    for (int i = 58; i > 0; --i)
    {
        uint64_t nc = ((c + n[i]) >> 1);
        n[i]        = c;
        c           = nc;
    }

    //
    // hcode[i] contains the length, l, of the
    // code for symbol i.  Assign the next available
    // code of length l to the symbol and store both
    // l and the code in hcode[i].
    //

    for (int i = 0; i < HUF_ENCSIZE; ++i)
    {
        uint64_t l = hcode[i];

        if (l > 0) hcode[i] = l | (n[l]++ << 6);
    }
}